

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O0

chirc_user_t * chirc_ctx_get_user(chirc_ctx_t *ctx,char *nick)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  byte *pbStack_40;
  uint _hf_bkt;
  uchar *_hj_key;
  uint local_30;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _hf_hashv;
  uint _uthash_hfstr_keylen;
  chirc_user_t *user;
  char *nick_local;
  chirc_ctx_t *ctx_local;
  
  sVar6 = strlen(nick);
  uVar1 = (uint)sVar6;
  __hf_hashv = (chirc_user_t *)0x0;
  if (ctx->users != (chirc_user_t *)0x0) {
    _hj_j = 0xfeedbeef;
    local_30 = 0x9e3779b9;
    _hj_k = 0x9e3779b9;
    pbStack_40 = (byte *)nick;
    for (_hj_key._4_4_ = uVar1; 0xb < _hj_key._4_4_; _hj_key._4_4_ = _hj_key._4_4_ - 0xc) {
      iVar2 = (uint)pbStack_40[4] + (uint)pbStack_40[5] * 0x100 + (uint)pbStack_40[6] * 0x10000 +
              (uint)pbStack_40[7] * 0x1000000 + local_30;
      uVar3 = (uint)pbStack_40[8] + (uint)pbStack_40[9] * 0x100 + (uint)pbStack_40[10] * 0x10000 +
              (uint)pbStack_40[0xb] * 0x1000000 + _hj_j;
      uVar4 = uVar3 >> 0xd ^
              (((uint)*pbStack_40 + (uint)pbStack_40[1] * 0x100 + (uint)pbStack_40[2] * 0x10000 +
                (uint)pbStack_40[3] * 0x1000000 + _hj_k) - iVar2) - uVar3;
      uVar5 = uVar4 << 8 ^ (iVar2 - uVar3) - uVar4;
      uVar3 = uVar5 >> 0xd ^ (uVar3 - uVar4) - uVar5;
      uVar4 = uVar3 >> 0xc ^ (uVar4 - uVar5) - uVar3;
      uVar5 = uVar4 << 0x10 ^ (uVar5 - uVar3) - uVar4;
      uVar3 = uVar5 >> 5 ^ (uVar3 - uVar4) - uVar5;
      _hj_k = uVar3 >> 3 ^ (uVar4 - uVar5) - uVar3;
      local_30 = _hj_k << 10 ^ (uVar5 - uVar3) - _hj_k;
      _hj_j = local_30 >> 0xf ^ (uVar3 - _hj_k) - local_30;
      pbStack_40 = pbStack_40 + 0xc;
    }
    _hj_j = _hj_j + uVar1;
    switch(_hj_key._4_4_) {
    case 0xb:
      _hj_j = (uint)pbStack_40[10] * 0x1000000 + _hj_j;
    case 10:
      _hj_j = (uint)pbStack_40[9] * 0x10000 + _hj_j;
    case 9:
      _hj_j = (uint)pbStack_40[8] * 0x100 + _hj_j;
    case 8:
      local_30 = (uint)pbStack_40[7] * 0x1000000 + local_30;
    case 7:
      local_30 = (uint)pbStack_40[6] * 0x10000 + local_30;
    case 6:
      local_30 = (uint)pbStack_40[5] * 0x100 + local_30;
    case 5:
      local_30 = pbStack_40[4] + local_30;
    case 4:
      _hj_k = (uint)pbStack_40[3] * 0x1000000 + _hj_k;
    case 3:
      _hj_k = (uint)pbStack_40[2] * 0x10000 + _hj_k;
    case 2:
      _hj_k = (uint)pbStack_40[1] * 0x100 + _hj_k;
    case 1:
      _hj_k = *pbStack_40 + _hj_k;
    default:
      uVar3 = _hj_j >> 0xd ^ (_hj_k - local_30) - _hj_j;
      uVar4 = uVar3 << 8 ^ (local_30 - _hj_j) - uVar3;
      uVar5 = uVar4 >> 0xd ^ (_hj_j - uVar3) - uVar4;
      uVar3 = uVar5 >> 0xc ^ (uVar3 - uVar4) - uVar5;
      uVar4 = uVar3 << 0x10 ^ (uVar4 - uVar5) - uVar3;
      uVar5 = uVar4 >> 5 ^ (uVar5 - uVar3) - uVar4;
      uVar3 = uVar5 >> 3 ^ (uVar3 - uVar4) - uVar5;
      uVar4 = uVar3 << 10 ^ (uVar4 - uVar5) - uVar3;
      uVar3 = uVar4 >> 0xf ^ (uVar5 - uVar3) - uVar4;
      __hf_hashv = (chirc_user_t *)0x0;
      if (ctx->users != (chirc_user_t *)0x0) {
        uVar4 = uVar3 & ((ctx->users->hh).tbl)->num_buckets - 1;
        if (((ctx->users->hh).tbl)->buckets[uVar4].hh_head == (UT_hash_handle *)0x0) {
          __hf_hashv = (chirc_user_t *)0x0;
        }
        else {
          __hf_hashv = (chirc_user_t *)
                       ((long)((ctx->users->hh).tbl)->buckets[uVar4].hh_head -
                       ((ctx->users->hh).tbl)->hho);
        }
        while ((__hf_hashv != (chirc_user_t *)0x0 &&
               ((((__hf_hashv->hh).hashv != uVar3 || ((__hf_hashv->hh).keylen != uVar1)) ||
                (iVar2 = memcmp((__hf_hashv->hh).key,nick,sVar6 & 0xffffffff), iVar2 != 0))))) {
          if ((__hf_hashv->hh).hh_next == (UT_hash_handle *)0x0) {
            __hf_hashv = (chirc_user_t *)0x0;
          }
          else {
            __hf_hashv = (chirc_user_t *)
                         ((long)(__hf_hashv->hh).hh_next - ((ctx->users->hh).tbl)->hho);
          }
        }
      }
    }
  }
  return __hf_hashv;
}

Assistant:

chirc_user_t* chirc_ctx_get_user(chirc_ctx_t *ctx, char *nick)
{
    chirc_user_t *user;

    HASH_FIND_STR(ctx->users, nick, user);

    return user;
}